

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O0

shared_ptr<TestSharedPtrObj> * __thiscall
rcc::shared_ptr<TestSharedPtrObj>::operator=
          (shared_ptr<TestSharedPtrObj> *this,shared_ptr<TestSharedPtrObj> *other)

{
  IObject *pIVar1;
  TestSharedPtrObj *local_30;
  shared_ptr<TestSharedPtrObj> *other_local;
  shared_ptr<TestSharedPtrObj> *this_local;
  
  if (this->obj_state != (IObjectSharedState *)0x0) {
    IObjectSharedState::DecrementObject(this->obj_state);
    IObjectSharedState::DecrementState(this->obj_state);
  }
  this->obj_state = other->obj_state;
  if (this->obj_state != (IObjectSharedState *)0x0) {
    pIVar1 = IObjectSharedState::GetIObject(this->obj_state);
    if (pIVar1 == (IObject *)0x0) {
      local_30 = (TestSharedPtrObj *)0x0;
    }
    else {
      local_30 = (TestSharedPtrObj *)
                 __dynamic_cast(pIVar1,&IObject::typeinfo,&TestSharedPtrObj::typeinfo,0);
    }
    this->obj_pointer = local_30;
    if (local_30 == (TestSharedPtrObj *)0x0) {
      this->obj_state = (IObjectSharedState *)0x0;
    }
    else {
      other->obj_state = (IObjectSharedState *)0x0;
      other->obj_pointer = (TestSharedPtrObj *)0x0;
    }
  }
  return this;
}

Assistant:

shared_ptr& operator=(shared_ptr<T>&& other){
            if(obj_state){
                obj_state->DecrementObject();
                obj_state->DecrementState();
            }
            obj_state = other.obj_state;
            if(obj_state){
                if((obj_pointer = dynamic_cast<T*>(this->obj_state->GetIObject()))){
                    other.obj_state = nullptr;
                    other.obj_pointer = nullptr;
                }else{
                    obj_state = nullptr;
                }
            }
            return *this;
        }